

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectOneSide(Gia_Man_t *p,int iSide)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Vec_Int_t *vNodes;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  iVar2 = p->nObjs;
  uVar7 = ~(p->vCos->nSize + p->vCis->nSize);
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < (iVar2 + uVar7) - 1) {
    iVar5 = iVar2 + uVar7;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar5;
  if (iVar5 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar5 << 2);
  }
  vNodes->pArray = piVar3;
  Gia_ManIncrementTravId(p);
  pVVar4 = p->vCos;
  uVar6 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar6 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return vNodes;
      }
      if (((uint)lVar8 & 1) == iSide) {
        pGVar1 = p->pObjs + iVar2;
        Gia_ManCollectOneSide_rec
                  (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vNodes);
      }
      lVar8 = lVar8 + 1;
      pVVar4 = p->vCos;
      uVar6 = (ulong)pVVar4->nSize;
    } while (lVar8 < (long)(uVar6 - (long)p->nRegs));
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManCollectOneSide( Gia_Man_t * p, int iSide )
{
    Gia_Obj_t * pObj; int i;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachPo( p, pObj, i )
        if ( (i & 1) == iSide )
            Gia_ManCollectOneSide_rec( p, Gia_ObjFanin0(pObj), vNodes );
    return vNodes;
}